

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall
helics::Federate::registerConnectorInterfacesJsonDetail(Federate *this,JsonBuffer *jsonBuffer)

{
  unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
  *this_00;
  char cVar1;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  bVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Core *pCVar5;
  _Head_base<0UL,_helics::PotentialInterfacesManager_*,_false> __ptr;
  string_view inputType_00;
  string_view endpointType;
  string_view outputType_00;
  string_view units_00;
  string_view filterType;
  string_view translatorType;
  _Alloc_hider _Var6;
  bool bVar7;
  bool bVar8;
  FilterTypes opType;
  TranslatorTypes ttype;
  int iVar9;
  iterator iVar10;
  const_reference pvVar11;
  undefined8 extraout_RAX;
  const_iterator cVar12;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar13;
  const_iterator cVar14;
  undefined8 extraout_RAX_00;
  anon_class_8_1_552cbcb6 callback;
  undefined8 uVar15;
  _Head_base<0UL,_helics::PotentialInterfacesManager_*,_false> this_01;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar16;
  anon_class_8_1_a8116966 callback_00;
  reference pbVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  undefined8 uVar19;
  HelicsException *pHVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  undefined1 uVar23;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  format_args args;
  format_args args_00;
  string_view message;
  string_view message_00;
  string_view fmt;
  string_view message_01;
  string_view name;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view fmt_00;
  string_view message_06;
  string_view endpoint;
  string_view endpoint_00;
  string_view endpoint_01;
  string_view message_07;
  string_view message_08;
  string_view message_09;
  string_view name_00;
  iterator __begin4;
  bool ret;
  value_type targets_1;
  string info;
  string outputType;
  string inputType;
  const_iterator __begin2_1;
  string operation;
  string key;
  const_iterator __begin2;
  string units;
  _Alloc_hider in_stack_fffffffffffffc30;
  undefined8 uVar24;
  undefined8 uStack_3c0;
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  undefined1 local_398 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  key_type local_348;
  undefined4 local_324;
  Federate *local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined4 local_2f4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_250;
  string local_230;
  string local_210;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_1f0;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_1e8;
  key_type local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_88;
  data local_80;
  data local_70;
  char *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_58;
  size_t local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_48;
  size_t local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_38;
  
  pbVar16 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             *)jsonBuffer->reference;
  uVar24 = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc38,"defaultglobal","");
  if ((pbVar16->field_0x0 == '\x01') &&
     (iVar10 = CLI::std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
               ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                        **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38),
     iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
    pvVar11 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
    local_3a8._M_allocated_capacity = local_3a8._M_allocated_capacity & 0xffffffffffffff00;
    nlohmann::json_abi_v3_11_3::detail::
    from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              (pvVar11,(boolean_t *)local_3a8._M_local_buf);
    local_324 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_3a8._M_local_buf[0]);
  }
  else {
    local_324 = 0;
  }
  if ((undefined1 *)uVar24 != local_3b8) {
    operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
  }
  if (pbVar16->field_0x0 != '\x01') goto LAB_001e22d9;
  cVar12 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[11],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(pbVar16 + 8),(char (*) [11])0x3d5de5);
  pbVar13 = pbVar16;
  if (cVar12._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8)) {
    pbVar13 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               *)nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(pbVar16,"interfaces");
  }
  if (*pbVar13 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) goto LAB_001e22d9;
  local_1f0 = pbVar13;
  cVar14 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[8],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(pbVar13 + 8),(char (*) [8])0x3efcee);
  local_320 = this;
  local_88 = pbVar16;
  if (cVar14._M_node != (_Base_ptr)(*(long *)(local_1f0 + 8) + 8)) {
    local_250.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(local_1f0,"filters");
    local_1e8.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_1e8.m_it.array_iterator._M_current = (pointer)0x0;
    local_1e8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    cVar1 = *(char *)local_250.m_object;
    if (cVar1 == '\0') {
      local_1e8.m_it.primitive_iterator.m_it = 1;
LAB_001e05b4:
      local_250.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_250.m_it.array_iterator._M_current = (pointer)0x0;
      local_250.m_it.primitive_iterator.m_it = 1;
    }
    else if (cVar1 == '\x02') {
      local_1e8.m_it.array_iterator._M_current =
           (((json_value *)((long)local_250.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_250.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_250.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_250.m_it.array_iterator._M_current =
           (((json_value *)((long)local_250.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (cVar1 != '\x01') {
        local_1e8.m_it.primitive_iterator.m_it = 0;
        goto LAB_001e05b4;
      }
      local_1e8.m_it.object_iterator._M_node =
           (_Base_ptr)((json_value *)((long)local_250.m_object + 8))->binary->m_subtype;
      local_250.m_it.array_iterator._M_current = (pointer)0x0;
      local_250.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_250.m_it.object_iterator._M_node =
           &(((json_value *)((long)local_250.m_object + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header._M_header;
    }
    local_1e8.m_object = local_250.m_object;
    bVar7 = nlohmann::json_abi_v3_11_3::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::
            operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                      (&local_1e8,&local_250);
    while (!bVar7) {
      pbVar16 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 *)nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(&local_1e8);
      uVar24 = local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc38,"name","");
      if ((*pbVar16 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar10 = CLI::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                   ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                            **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38),
         iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
        if ((pvVar11->m_data).m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_210,pvVar11);
        }
        else {
          fileops::generateJsonString(&local_210,pvVar11,true);
        }
      }
      else {
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        local_210._M_string_length = 0;
        local_210.field_2._M_allocated_capacity =
             local_210.field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      if ((undefined1 *)uVar24 != local_3b8) {
        operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
      }
      uVar24 = local_3b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc38,"inputType","");
      if ((*pbVar16 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar10 = CLI::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                   ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                            **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38),
         iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
        if ((pvVar11->m_data).m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_270,pvVar11);
        }
        else {
          fileops::generateJsonString(&local_270,pvVar11,true);
        }
      }
      else {
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        local_270._M_string_length = 0;
        local_270.field_2._M_local_buf[0] = '\0';
      }
      if ((undefined1 *)uVar24 != local_3b8) {
        operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
      }
      uVar24 = local_3b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc38,"outputType","");
      if ((*pbVar16 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar10 = CLI::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                   ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                            **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38),
         iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
        if ((pvVar11->m_data).m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_2d0,pvVar11);
        }
        else {
          fileops::generateJsonString(&local_2d0,pvVar11,true);
        }
      }
      else {
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        local_2d0._M_string_length = 0;
        local_2d0.field_2._M_local_buf[0] = '\0';
      }
      if ((undefined1 *)uVar24 != local_3b8) {
        operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
      }
      uVar24 = local_3b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc38,"cloning","");
      if ((*pbVar16 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar10 = CLI::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                   ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                            **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38),
         iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
        local_3a8._M_allocated_capacity = local_3a8._M_allocated_capacity & 0xffffffffffffff00;
        nlohmann::json_abi_v3_11_3::detail::
        from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  (pvVar11,(boolean_t *)local_3a8._M_local_buf);
        local_2f4 = (undefined4)
                    CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),local_3a8._M_local_buf[0]);
      }
      else {
        local_2f4 = 0;
      }
      if ((undefined1 *)uVar24 != local_3b8) {
        operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
      }
      bVar7 = local_2d0._M_string_length != 0;
      bVar8 = local_270._M_string_length != 0;
      uVar24 = local_3b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc38,"global","");
      uVar23 = (char)local_324;
      if (*pbVar16 ==
          (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           )0x1) {
        iVar10 = CLI::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                 ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                          **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38);
        uVar23 = (char)local_324;
        if (iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8)) {
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
          local_3a8._M_allocated_capacity = local_3a8._M_allocated_capacity & 0xffffffffffffff00;
          nlohmann::json_abi_v3_11_3::detail::
          from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    (pvVar11,(boolean_t *)local_3a8._M_local_buf);
          uVar23 = local_3a8._M_local_buf[0];
        }
      }
      if ((undefined1 *)uVar24 != local_3b8) {
        operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
      }
      uVar24 = local_3b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc38,"operation","");
      local_3a8._M_allocated_capacity = (size_type)local_398;
      if ((char)local_2f4 == '\0') {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"custom","");
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"clone","");
      }
      uVar19 = local_3a8._8_8_;
      uVar15 = local_3a8._M_allocated_capacity;
      if ((*pbVar16 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar10 = CLI::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                   ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                            **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38),
         iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
        if ((pvVar11->m_data).m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_230,pvVar11);
        }
        else {
          fileops::generateJsonString(&local_230,pvVar11,true);
        }
      }
      else {
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_230,uVar15,
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    *)(uVar19 + uVar15));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398) {
        operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
      }
      this = local_320;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar24 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8) {
        operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
      }
      filterType._M_str = (char *)uVar24;
      filterType._M_len = (size_t)in_stack_fffffffffffffc30._M_p;
      opType = filterTypeFromString(filterType);
      bVar7 = checkValidFilterType(this,bVar7 || bVar8,opType,&local_230);
      if (bVar7) {
        local_40 = local_270._M_string_length;
        paStack_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_270._M_dataplus._M_p;
        local_50 = local_2d0._M_string_length;
        paStack_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_2d0._M_dataplus._M_p;
        in_R9._4_4_ = 0;
        in_R9._0_4_ = opType;
        inputType_00._M_str = local_270._M_dataplus._M_p;
        inputType_00._M_len = local_270._M_string_length;
        outputType_00._M_str = local_2d0._M_dataplus._M_p;
        outputType_00._M_len = local_2d0._M_string_length;
        name_00._M_str = local_210._M_dataplus._M_p;
        name_00._M_len = local_210._M_string_length;
        in_stack_fffffffffffffc30._M_p = local_2d0._M_dataplus._M_p;
        callback.filter =
             generateFilter(this,(bool)uVar23,(bool)(char)local_2f4,name_00,opType,inputType_00,
                            outputType_00);
        paVar22 = &local_348.field_2;
        local_348.field_2._M_local_buf[4] = 's';
        local_348.field_2._M_allocated_capacity._0_4_ = 0x67616c66;
        local_348._M_string_length = 5;
        local_348.field_2._M_local_buf[5] = '\0';
        local_368._8_8_ = this;
        local_368._0_8_ = callback.filter;
        local_348._M_dataplus._M_p = (pointer)paVar22;
        if ((*pbVar16 ==
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x1) &&
           (iVar10 = CLI::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                     ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                              **)(pbVar16 + 8),&local_348),
           iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar16,&local_348);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_2f0,pvVar11);
          if (local_2f0._M_local_buf[0] == '\x02') {
            uVar24 = &local_2f0;
            uStack_3c0 = (_Rb_tree_node_base *)0x0;
            local_3b8._8_8_ = (code *)0x8000000000000000;
            local_3b8._0_8_ = *(undefined8 *)local_2f0._8_8_;
            local_3a8._8_8_ = 0;
            local_398._8_8_ = (code *)0x8000000000000000;
            local_398._0_8_ = *(size_type *)(local_2f0._8_8_ + 8);
            local_3a8._M_allocated_capacity = uVar24;
            while (bVar7 = nlohmann::json_abi_v3_11_3::detail::
                           iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           ::
                           operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                     ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)&stack0xfffffffffffffc38,
                                      (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)&local_3a8), !bVar7) {
              pbVar17 = nlohmann::json_abi_v3_11_3::detail::
                        iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                     *)&stack0xfffffffffffffc38);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_388,pbVar17);
              loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Filter>
              ::anon_class_16_2_14a9c628::operator()
                        ((anon_class_16_2_14a9c628 *)(local_378 + 0x10),(string *)&local_388);
              if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
                operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1)
                               );
              }
              if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    *)uVar24 ==
                  (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   )0x2) {
                local_3b8._0_8_ = local_3b8._0_8_ + 0x10;
              }
              else if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)uVar24 ==
                       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        )0x1) {
                uStack_3c0 = std::_Rb_tree_increment((_Rb_tree_node_base *)uStack_3c0);
              }
              else {
                local_3b8._8_8_ = local_3b8._8_8_ + 1;
              }
            }
          }
          else {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((string *)&stack0xfffffffffffffc38,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_2f0);
            loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Filter>
            ::anon_class_16_2_14a9c628::operator()
                      ((anon_class_16_2_14a9c628 *)(local_378 + 0x10),
                       (string *)&stack0xfffffffffffffc38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar24 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8) {
              operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
            }
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_2f0);
        }
        if ((((local_348._M_dataplus._M_p + -1)[local_348._M_string_length] == 's') &&
            (CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             pop_back(&local_348),
            *pbVar16 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x1)) &&
           (iVar10 = CLI::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                     ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                              **)(pbVar16 + 8),&local_348),
           iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar16,&local_348);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&stack0xfffffffffffffc38,pvVar11);
          loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Filter>
          ::anon_class_16_2_14a9c628::operator()
                    ((anon_class_16_2_14a9c628 *)(local_378 + 0x10),
                     (string *)&stack0xfffffffffffffc38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar24 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8) {
            operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != paVar22) {
          operator_delete(local_348._M_dataplus._M_p,
                          CONCAT26(local_348.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_348.field_2._M_local_buf[5],
                                            CONCAT14(local_348.field_2._M_local_buf[4],
                                                     local_348.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_3b8._8_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
             ::_M_invoke;
        local_3b8._0_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
             ::_M_manager;
        local_3a8._M_allocated_capacity = 0;
        local_3a8._8_8_ = 0;
        local_398._8_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
             ::_M_invoke;
        local_398._0_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
             ::_M_manager;
        local_388._8_8_ = 0;
        local_378._8_8_ =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
             ::_M_invoke;
        local_378._0_8_ =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
             ::_M_manager;
        local_388._M_allocated_capacity = (size_type)callback.filter;
        processOptions((json *)pbVar16,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&stack0xfffffffffffffc38,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_3a8,(function<void_(int,_int)> *)&local_388);
        if ((_func_int **)local_378._0_8_ != (_func_int **)0x0) {
          (*(code *)local_378._0_8_)(&local_388,&local_388,3);
        }
        if ((code *)local_398._0_8_ != (code *)0x0) {
          (*(code *)local_398._0_8_)(&local_3a8,&local_3a8,3);
        }
        if ((code *)local_3b8._0_8_ != (code *)0x0) {
          (*(code *)local_3b8._0_8_)(&stack0xfffffffffffffc38,&stack0xfffffffffffffc38,3);
        }
        uVar24 = local_3b8;
        local_3b8._0_5_ = 0x6f666e69;
        if ((*pbVar16 ==
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x1) &&
           (iVar10 = CLI::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                     ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                              **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38),
           iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
          if ((pvVar11->m_data).m_type == string) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_2f0,pvVar11);
          }
          else {
            fileops::generateJsonString((string *)&local_2f0,pvVar11,true);
          }
        }
        else {
          local_2f0._M_allocated_capacity = (size_type)&local_2e0;
          local_2f0._8_8_ = (size_type *)0x0;
          local_2e0._M_local_buf[0] = '\0';
        }
        if ((undefined1 *)uVar24 != local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
        if ((size_type *)local_2f0._8_8_ != (size_type *)0x0) {
          pCVar5 = ((callback.filter)->super_Interface).mCore;
          (*pCVar5->_vptr_Core[0x60])
                    (pCVar5,(ulong)(uint)((callback.filter)->super_Interface).handle.hid);
        }
        local_3b8._8_8_ =
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
             ::_M_invoke;
        local_3b8._0_8_ =
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
             ::_M_manager;
        loadTags((json *)pbVar16,
                 (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)&stack0xfffffffffffffc38);
        if ((code *)local_3b8._0_8_ != (code *)0x0) {
          (*(code *)local_3b8._0_8_)(&stack0xfffffffffffffc38,&stack0xfffffffffffffc38,3);
        }
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        local_318.field_2._M_allocated_capacity._4_2_ = 0x6563;
        local_318.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
        local_318._M_string_length = 6;
        local_318.field_2._M_local_buf[6] = '\0';
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        local_290.field_2._M_allocated_capacity._0_4_ = 0x67726174;
        local_290._M_string_length = 7;
        local_290.field_2._M_allocated_capacity._4_4_ = 0x737465;
        local_3a8._M_allocated_capacity = (size_type)local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_318._M_dataplus._M_p,
                   (undefined1 *)((long)&local_318.field_2 + 6));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   "_");
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3a8,local_290._M_dataplus._M_p,local_290._M_string_length);
        uVar24 = local_3b8;
        pcVar3 = (pbVar18->_M_dataplus)._M_p;
        paVar21 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar21) {
          local_3b8._0_8_ = paVar21->_M_allocated_capacity;
          local_3b8._8_8_ = *(long *)((long)&pbVar18->field_2 + 8);
        }
        else {
          local_3b8._0_8_ = paVar21->_M_allocated_capacity;
          uVar24 = pcVar3;
        }
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar21;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        bVar7 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                          ((json *)pbVar16,(string *)&stack0xfffffffffffffc38,
                           (anon_class_8_1_a8116966)callback.filter);
        if ((undefined1 *)uVar24 != local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
        if ((undefined1 *)local_3a8._M_allocated_capacity != local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
        }
        if (!bVar7) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_388,&local_318,&local_290);
          bVar7 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                            ((json *)pbVar16,(string *)&local_388,
                             (anon_class_8_1_a8116966)callback.filter);
          if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
            operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1));
          }
          _Var6._M_p = local_290._M_dataplus._M_p;
          if (!bVar7) {
            iVar9 = toupper((int)*local_290._M_dataplus._M_p);
            *_Var6._M_p = (char)iVar9;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_378 + 0x10),&local_318,&local_290);
            addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                      ((json *)pbVar16,(string *)(local_378 + 0x10),
                       (anon_class_8_1_a8116966)callback.filter);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT44(local_290.field_2._M_allocated_capacity._4_4_,
                                   local_290.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,
                          CONCAT17(local_318.field_2._M_local_buf[7],
                                   CONCAT16(local_318.field_2._M_local_buf[6],
                                            CONCAT24(local_318.field_2._M_allocated_capacity._4_2_,
                                                     local_318.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        local_318.field_2._M_allocated_capacity._0_4_ = 0x74736564;
        local_318.field_2._M_allocated_capacity._4_2_ = 0x6e69;
        local_318.field_2._M_local_buf[6] = 'a';
        local_318.field_2._7_4_ = 0x6e6f6974;
        local_318._M_string_length = 0xb;
        local_318.field_2._M_local_buf[0xb] = '\0';
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        local_2b0.field_2._M_allocated_capacity._0_4_ = 0x67726174;
        local_2b0._M_string_length = 7;
        local_2b0.field_2._M_allocated_capacity._4_4_ = 0x737465;
        local_3a8._M_allocated_capacity = (size_type)local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_318._M_dataplus._M_p,
                   (undefined1 *)((long)&local_318.field_2 + 0xb));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   "_");
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3a8,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
        uVar24 = local_3b8;
        pcVar3 = (pbVar18->_M_dataplus)._M_p;
        paVar21 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar21) {
          local_3b8._0_8_ = paVar21->_M_allocated_capacity;
          local_3b8._8_8_ = *(long *)((long)&pbVar18->field_2 + 8);
        }
        else {
          local_3b8._0_8_ = paVar21->_M_allocated_capacity;
          uVar24 = pcVar3;
        }
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar21;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        bVar7 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                          ((json *)pbVar16,(string *)&stack0xfffffffffffffc38,
                           (anon_class_8_1_a8116966)callback.filter);
        if ((undefined1 *)uVar24 != local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
        if ((undefined1 *)local_3a8._M_allocated_capacity != local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
        }
        if (!bVar7) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_388,&local_318,&local_2b0);
          bVar7 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                            ((json *)pbVar16,(string *)&local_388,
                             (anon_class_8_1_a8116966)callback.filter);
          if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
            operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1));
          }
          _Var6._M_p = local_2b0._M_dataplus._M_p;
          if (!bVar7) {
            iVar9 = toupper((int)*local_2b0._M_dataplus._M_p);
            *_Var6._M_p = (char)iVar9;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_378 + 0x10),&local_318,&local_2b0);
            addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                      ((json *)pbVar16,(string *)(local_378 + 0x10),
                       (anon_class_8_1_a8116966)callback.filter);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,
                          CONCAT44(local_2b0.field_2._M_allocated_capacity._4_4_,
                                   local_2b0.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,
                          CONCAT17(local_318.field_2._M_local_buf[7],
                                   CONCAT16(local_318.field_2._M_local_buf[6],
                                            CONCAT24(local_318.field_2._M_allocated_capacity._4_2_,
                                                     local_318.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_allocated_capacity != &local_2e0) {
          operator_delete((void *)local_2f0._M_allocated_capacity,
                          CONCAT71(local_2e0._M_allocated_capacity._1_7_,local_2e0._M_local_buf[0])
                          + 1);
        }
        local_348._M_dataplus._M_p = (pointer)paVar22;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"source","");
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"endpoints","");
        local_3a8._M_allocated_capacity = (size_type)local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_348._M_dataplus._M_p,
                   local_348._M_string_length + local_348._M_dataplus._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   "_");
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3a8,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        uVar24 = local_3b8;
        pcVar3 = (pbVar18->_M_dataplus)._M_p;
        paVar21 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar21) {
          local_3b8._0_8_ = paVar21->_M_allocated_capacity;
          local_3b8._8_8_ = *(long *)((long)&pbVar18->field_2 + 8);
        }
        else {
          local_3b8._0_8_ = paVar21->_M_allocated_capacity;
          uVar24 = pcVar3;
        }
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar21;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__3>
                          ((json *)pbVar16,(string *)&stack0xfffffffffffffc38,callback);
        if ((undefined1 *)uVar24 != local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
        if ((undefined1 *)local_3a8._M_allocated_capacity != local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
        }
        if (!bVar7) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_388,&local_348,&local_a8);
          bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__3>
                            ((json *)pbVar16,(string *)&local_388,callback);
          if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
            operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1));
          }
          _Var6._M_p = local_a8._M_dataplus._M_p;
          if (!bVar7) {
            iVar9 = toupper((int)*local_a8._M_dataplus._M_p);
            *_Var6._M_p = (char)iVar9;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_378 + 0x10),&local_348,&local_a8);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__3>
                      ((json *)pbVar16,(string *)(local_378 + 0x10),callback);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != paVar22) {
          operator_delete(local_348._M_dataplus._M_p,
                          CONCAT26(local_348.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_348.field_2._M_local_buf[5],
                                            CONCAT14(local_348.field_2._M_local_buf[4],
                                                     local_348.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_348._M_dataplus._M_p = (pointer)paVar22;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"destination","");
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"endpoints","");
        local_3a8._M_allocated_capacity = (size_type)local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_348._M_dataplus._M_p,
                   local_348._M_string_length + local_348._M_dataplus._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   "_");
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3a8,local_c8._M_dataplus._M_p,local_c8._M_string_length);
        uVar24 = local_3b8;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar18->_M_dataplus)._M_p;
        paVar21 = &pbVar18->field_2;
        if (paVar4 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)paVar21) {
          local_3b8._0_8_ = paVar21->_M_allocated_capacity;
          local_3b8._8_8_ = *(long *)((long)&pbVar18->field_2 + 8);
        }
        else {
          local_3b8._0_8_ = paVar21->_M_allocated_capacity;
          uVar24 = paVar4;
        }
        uStack_3c0 = pbVar18->_M_string_length;
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar21;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__4>
                          ((json *)pbVar16,(string *)&stack0xfffffffffffffc38,callback);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
        }
        if (!bVar7) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_388,&local_348,&local_c8);
          bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__4>
                            ((json *)pbVar16,(string *)&local_388,callback);
          if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
            operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1));
          }
          _Var6._M_p = local_c8._M_dataplus._M_p;
          if (!bVar7) {
            iVar9 = toupper((int)*local_c8._M_dataplus._M_p);
            *_Var6._M_p = (char)iVar9;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_378 + 0x10),&local_348,&local_c8);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__4>
                      ((json *)pbVar16,(string *)(local_378 + 0x10),callback);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != paVar22) {
          operator_delete(local_348._M_dataplus._M_p,
                          CONCAT26(local_348.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_348.field_2._M_local_buf[5],
                                            CONCAT14(local_348.field_2._M_local_buf[4],
                                                     local_348.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if ((char)local_2f4 != '\0') {
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"delivery","");
          if ((*pbVar16 ==
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                )0x1) &&
             (iVar10 = CLI::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                       ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                **)(pbVar16 + 8),&local_1c8),
             iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
            pvVar11 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pbVar16,&local_1c8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)(local_378 + 0x10),pvVar11);
            if (local_368[0] == '\x02') {
              uVar24 = local_378 + 0x10;
              uStack_3c0 = (_Rb_tree_node_base *)0x0;
              local_3b8._8_8_ = (code *)0x8000000000000000;
              local_3b8._0_8_ = *(undefined8 *)local_368._8_8_;
              local_3a8._8_8_ = 0;
              local_398._8_8_ = (code *)0x8000000000000000;
              local_398._0_8_ =
                   *(undefined8 *)&((atomic<helics::Federate::Modes> *)(local_368._8_8_ + 8))->_M_i;
              local_3a8._M_allocated_capacity = uVar24;
              while (bVar7 = nlohmann::json_abi_v3_11_3::detail::
                             iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             ::
                             operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                       ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                         *)&stack0xfffffffffffffc38,
                                        (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                         *)&local_3a8), !bVar7) {
                pbVar17 = nlohmann::json_abi_v3_11_3::detail::
                          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)&stack0xfffffffffffffc38);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_388,pbVar17);
                endpoint._M_str = (char *)local_388._M_allocated_capacity;
                endpoint._M_len = local_388._8_8_;
                CloningFilter::addDeliveryEndpoint((CloningFilter *)callback.filter,endpoint);
                if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
                  operator_delete((void *)local_388._M_allocated_capacity,
                                  (ulong)(local_378._0_8_ + 1));
                }
                if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      *)uVar24 ==
                    (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     )0x2) {
                  local_3b8._0_8_ = local_3b8._0_8_ + 0x10;
                }
                else if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)uVar24 ==
                         (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          )0x1) {
                  uStack_3c0 = std::_Rb_tree_increment((_Rb_tree_node_base *)uStack_3c0);
                }
                else {
                  local_3b8._8_8_ = local_3b8._8_8_ + 1;
                }
              }
            }
            else {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&stack0xfffffffffffffc38,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)(local_378 + 0x10));
              endpoint_00._M_str = (char *)uVar24;
              endpoint_00._M_len = uStack_3c0;
              CloningFilter::addDeliveryEndpoint((CloningFilter *)callback.filter,endpoint_00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar24 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8) {
                operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
              }
            }
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)(local_378 + 0x10));
          }
          if (((local_1c8._M_dataplus._M_p[local_1c8._M_string_length - 1] == 's') &&
              (CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::pop_back(&local_1c8),
              *pbVar16 ==
              (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               )0x1)) &&
             (iVar10 = CLI::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                       ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                **)(pbVar16 + 8),&local_1c8),
             iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
            pvVar11 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pbVar16,&local_1c8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&stack0xfffffffffffffc38,pvVar11);
            endpoint_01._M_str = (char *)uVar24;
            endpoint_01._M_len = uStack_3c0;
            CloningFilter::addDeliveryEndpoint((CloningFilter *)callback.filter,endpoint_01);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar24 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8) {
              operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
        if (*pbVar16 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x1) {
          bVar7 = this->strictConfigChecking;
          cVar12 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                   ::_M_find_tr<char[11],void>
                             (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                **)(pbVar16 + 8),(char (*) [11])"properties");
          if (cVar12._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8)) {
            uVar15 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>(pbVar16,"properties");
            if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)uVar15 ==
                (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 )0x1) {
              cVar14 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       ::_M_find_tr<char[5],void>
                                 (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                    **)(uVar15 + 8),(char (*) [5])0x3e09a3);
              if (((cVar14._M_node ==
                    (_Base_ptr)
                    (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       **)(uVar15 + 8) + 8)) ||
                  (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)uVar15 !=
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    )0x1)) ||
                 (cVar14 = std::
                           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           ::_M_find_tr<char[6],void>
                                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                        **)(uVar15 + 8),(char (*) [6])0x3f8ab9),
                 cVar14._M_node == (_Base_ptr)(*(long *)(uVar15 + 8) + 8))) goto LAB_001e1dae;
              pvVar11 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                    *)uVar15,"value");
              if ((byte)((pvVar11->m_data).m_type - number_integer) < 3) {
                pvVar11 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)uVar15,"name");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&stack0xfffffffffffffc38,pvVar11);
                uVar19 = uVar24;
                pvVar11 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)uVar15,"value");
                local_3a8._M_allocated_capacity = 0;
                nlohmann::json_abi_v3_11_3::detail::
                get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                          (pvVar11,(double *)&local_3a8._M_allocated_capacity);
                (*((callback.filter)->super_Interface)._vptr_Interface[5])
                          ((int)local_3a8._M_allocated_capacity,callback.filter,uStack_3c0,uVar24);
                this = local_320;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)uVar19 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8) {
                  operator_delete((void *)uVar19,local_3b8._0_8_ + 1);
                  this = local_320;
                }
              }
              else {
                pvVar11 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)uVar15,"name");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&stack0xfffffffffffffc38,pvVar11);
                uVar19 = uVar24;
                pvVar11 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)uVar15,"value");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_3a8,pvVar11);
                (*((callback.filter)->super_Interface)._vptr_Interface[6])
                          (callback.filter,uStack_3c0,uVar24,local_3a8._8_8_,
                           local_3a8._M_allocated_capacity);
                this = local_320;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a8._M_allocated_capacity !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_398) {
                  operator_delete((void *)local_3a8._M_allocated_capacity,
                                  (ulong)(local_398._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)uVar19 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8) {
                  operator_delete((void *)uVar19,local_3b8._0_8_ + 1);
                }
              }
            }
            else if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)uVar15 ==
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      )0x2) {
              uStack_3c0 = (_Rb_tree_node_base *)0x0;
              local_3b8._0_8_ = 0;
              local_3b8._8_8_ = (code *)0x8000000000000000;
              bVar2 = *(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)uVar15;
              if (bVar2 == (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            )0x0) {
                local_3b8._8_8_ = (code *)0x1;
LAB_001e1e21:
                local_3a8._8_8_ = 0;
                local_398._0_8_ = (code *)0x0;
                local_398._8_8_ = (code *)0x1;
              }
              else if (bVar2 == (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 )0x2) {
                local_3b8._0_8_ = **(size_type **)(uVar15 + 8);
                local_3a8._8_8_ = 0;
                local_398._8_8_ = (code *)0x8000000000000000;
                local_398._0_8_ = *(size_type *)(*(long *)(uVar15 + 8) + 8);
              }
              else {
                if (bVar2 != (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              )0x1) {
                  local_3b8._8_8_ = (code *)0x0;
                  goto LAB_001e1e21;
                }
                uStack_3c0 = *(undefined8 *)(*(long *)(uVar15 + 8) + 0x18);
                local_398._0_8_ = (code *)0x0;
                local_398._8_8_ = (code *)0x8000000000000000;
                local_3a8._8_8_ = *(long *)(uVar15 + 8) + 8;
              }
              local_3a8._M_allocated_capacity = uVar15;
              bVar8 = nlohmann::json_abi_v3_11_3::detail::
                      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      ::
                      operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                  *)&stack0xfffffffffffffc38,
                                 (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                  *)&local_3a8);
              while (!bVar8) {
                pbVar16 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)nlohmann::json_abi_v3_11_3::detail::
                             iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                          *)&stack0xfffffffffffffc38);
                if (*pbVar16 ==
                    (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     )0x1) {
                  cVar14 = std::
                           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           ::_M_find_tr<char[5],void>
                                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                        **)(pbVar16 + 8),(char (*) [5])0x3e09a3);
                  if (((cVar14._M_node ==
                        (_Base_ptr)
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)(pbVar16 + 8) + 8)) ||
                      (*pbVar16 !=
                       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        )0x1)) ||
                     (cVar14 = std::
                               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                               ::_M_find_tr<char[6],void>
                                         (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                            **)(pbVar16 + 8),(char (*) [6])0x3f8ab9),
                     cVar14._M_node == (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) goto LAB_001e2045;
                  pvVar11 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>(pbVar16,"value");
                  if ((byte)((pvVar11->m_data).m_type - number_integer) < 3) {
                    pvVar11 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>(pbVar16,"name");
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (&local_388,pvVar11);
                    uVar19 = local_388._8_8_;
                    uVar24 = local_388._M_allocated_capacity;
                    pvVar11 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>(pbVar16,"value");
                    local_368._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    nlohmann::json_abi_v3_11_3::detail::
                    get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                              (pvVar11,(double *)(local_378 + 0x10));
                    (*((callback.filter)->super_Interface)._vptr_Interface[5])
                              ((int)local_368._0_8_,callback.filter,uVar19,uVar24);
                    this = local_320;
                    if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
                      operator_delete((void *)local_388._M_allocated_capacity,
                                      (ulong)(local_378._0_8_ + 1));
                      this = local_320;
                    }
                  }
                  else {
                    pvVar11 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>(pbVar16,"name");
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (&local_388,pvVar11);
                    uVar19 = local_388._8_8_;
                    uVar24 = local_388._M_allocated_capacity;
                    pvVar11 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>(pbVar16,"value");
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (local_378 + 0x10,pvVar11);
                    (*((callback.filter)->super_Interface)._vptr_Interface[6])
                              (callback.filter,uVar19,uVar24,local_368._8_8_,local_368._0_8_);
                    this = local_320;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_368._0_8_ != &local_358) {
                      operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
                    }
                    if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
                      operator_delete((void *)local_388._M_allocated_capacity,
                                      (ulong)(local_378._0_8_ + 1));
                    }
                  }
                }
                else {
LAB_001e2045:
                  if (bVar7 != false) goto LAB_001e4693;
                  message_00._M_str = "interface properties require \"name\" and \"value\" fields";
                  message_00._M_len = 0x36;
                  logMessage(this,3,message_00);
                }
                if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      *)uVar15 ==
                    (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     )0x2) {
                  local_3b8._0_8_ = local_3b8._0_8_ + 0x10;
                }
                else if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)uVar15 ==
                         (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          )0x1) {
                  uStack_3c0 = std::_Rb_tree_increment((_Rb_tree_node_base *)uStack_3c0);
                }
                else {
                  local_3b8._8_8_ = local_3b8._8_8_ + 1;
                }
                bVar8 = nlohmann::json_abi_v3_11_3::detail::
                        iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        ::
                        operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                  ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                    *)&stack0xfffffffffffffc38,
                                   (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                    *)&local_3a8);
              }
            }
            else {
LAB_001e1dae:
              if (bVar7 != false) {
LAB_001e4693:
                message_04._M_str = "interface properties require \"name\" and \"value\" fields";
                message_04._M_len = 0x36;
                logMessage(this,0,message_04);
                pHVar20 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_07._M_str = "interface properties require \"name\" and \"value\" fields";
                message_07._M_len = 0x36;
                HelicsException::HelicsException(pHVar20,message_07);
                *(undefined ***)pHVar20 = &PTR__HelicsException_004caa00;
                __cxa_throw(pHVar20,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
              }
              message._M_str = "interface properties require \"name\" and \"value\" fields";
              message._M_len = 0x36;
              logMessage(this,3,message);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                 local_230.field_2._M_local_buf[0]) + 1);
      }
      pbVar16 = local_88;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,
                        CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                                 local_2d0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,
                        CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                 local_270.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,
                        (ulong)(local_210.field_2._M_allocated_capacity + 1));
      }
      if (*(char *)local_1e8.m_object == '\x02') {
        local_1e8.m_it.array_iterator._M_current = local_1e8.m_it.array_iterator._M_current + 1;
      }
      else if (*(char *)local_1e8.m_object == '\x01') {
        local_1e8.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_1e8.m_it.object_iterator._M_node);
      }
      else {
        local_1e8.m_it.primitive_iterator.m_it = local_1e8.m_it.primitive_iterator.m_it + 1;
      }
      bVar7 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        (&local_1e8,&local_250);
    }
  }
  if ((*local_1f0 !=
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) ||
     (cVar12 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
               ::_M_find_tr<char[12],void>
                         (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                            **)(local_1f0 + 8),(char (*) [12])0x3eb82d),
     cVar12._M_node == (_Base_ptr)(*(long *)(local_1f0 + 8) + 8))) goto LAB_001e22d9;
  local_250.m_object =
       nlohmann::json_abi_v3_11_3::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       ::operator[]<char_const>(local_1f0,"translators");
  local_250.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
  local_250.m_it.array_iterator._M_current = (pointer)0x0;
  local_250.m_it.primitive_iterator.m_it = -0x8000000000000000;
  cVar1 = *(char *)local_250.m_object;
  if (cVar1 == '\0') {
    local_250.m_it.primitive_iterator.m_it = 1;
LAB_001e2298:
    local_210._M_string_length = 0;
    local_210.field_2._M_allocated_capacity = 0;
    local_210.field_2._8_8_ = 1;
  }
  else if (cVar1 == '\x02') {
    local_250.m_it.array_iterator._M_current =
         (((json_value *)((long)local_250.m_object + 8))->array->
         super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_210._M_string_length = 0;
    local_210.field_2._8_8_ = 0x8000000000000000;
    local_210.field_2._M_allocated_capacity =
         (size_type)
         (((json_value *)((long)local_250.m_object + 8))->array->
         super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (cVar1 != '\x01') {
      local_250.m_it.primitive_iterator.m_it = 0;
      goto LAB_001e2298;
    }
    local_250.m_it.object_iterator._M_node =
         (_Base_ptr)((json_value *)((long)local_250.m_object + 8))->binary->m_subtype;
    local_210.field_2._M_allocated_capacity = 0;
    local_210.field_2._8_8_ = 0x8000000000000000;
    local_210._M_string_length =
         (size_type)
         &(((json_value *)((long)local_250.m_object + 8))->object->_M_t)._M_impl.
          super__Rb_tree_header;
  }
  local_210._M_dataplus._M_p = (pointer)local_250.m_object;
  bVar7 = nlohmann::json_abi_v3_11_3::detail::
          iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
          ::
          operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                    (&local_250,
                     (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      *)&local_210);
  pbVar16 = local_88;
  if (!bVar7) {
    do {
      pbVar16 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 *)nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(&local_250);
      uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc38,"name","");
      if ((*pbVar16 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar10 = CLI::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                   ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                            **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38),
         iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
        if ((pvVar11->m_data).m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_270,pvVar11);
        }
        else {
          fileops::generateJsonString(&local_270,pvVar11,true);
        }
      }
      else {
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        local_270._M_string_length = 0;
        local_270.field_2._M_local_buf[0] = '\0';
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar24 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8) {
        operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
      }
      uVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc38,"type","");
      local_3a8._M_allocated_capacity = (size_type)local_398;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"custom","");
      uVar15 = local_3a8._8_8_;
      uVar24 = local_3a8._M_allocated_capacity;
      if ((*pbVar16 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar10 = CLI::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                   ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                            **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38),
         iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
        if ((pvVar11->m_data).m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_2d0,pvVar11);
        }
        else {
          fileops::generateJsonString(&local_2d0,pvVar11,true);
        }
      }
      else {
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2d0,uVar24,(char *)(uVar15 + uVar24));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398) {
        operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar19 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8) {
        operator_delete((void *)uVar19,local_3b8._0_8_ + 1);
      }
      translatorType._M_str = (char *)uVar19;
      translatorType._M_len = (size_t)in_stack_fffffffffffffc30._M_p;
      ttype = translatorTypeFromString(translatorType);
      uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc38,"endpointtype","");
      if ((*pbVar16 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar10 = CLI::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                   ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                            **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38),
         iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
        if ((pvVar11->m_data).m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_230,pvVar11);
        }
        else {
          fileops::generateJsonString(&local_230,pvVar11,true);
        }
      }
      else {
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        local_230._M_string_length = 0;
        local_230.field_2._M_local_buf[0] = '\0';
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar24 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8) {
        operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
      }
      uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc38,"unit","");
      if ((*pbVar16 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar10 = CLI::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                   ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                            **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38),
         iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
        if ((pvVar11->m_data).m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_1a8,pvVar11);
        }
        else {
          fileops::generateJsonString(&local_1a8,pvVar11,true);
        }
      }
      else {
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        local_1a8._M_string_length = 0;
        local_1a8.field_2._M_local_buf[0] = '\0';
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar24 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8) {
        operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
      }
      uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc38,"units","")
      ;
      if ((*pbVar16 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar10 = CLI::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                   ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                            **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38),
         iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_1e8,pvVar11);
        registerConnectorInterfacesJsonDetail();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar24 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8) {
        operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
      }
      uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc38,"global","");
      uVar23 = (char)local_324;
      if (*pbVar16 ==
          (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           )0x1) {
        iVar10 = CLI::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                 ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                          **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38);
        uVar23 = (char)local_324;
        if (iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8)) {
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
          local_3a8._M_allocated_capacity = local_3a8._M_allocated_capacity & 0xffffffffffffff00;
          nlohmann::json_abi_v3_11_3::detail::
          from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    (pvVar11,(boolean_t *)local_3a8._M_local_buf);
          uVar23 = local_3a8._M_local_buf[0];
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar24 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8) {
        operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
      }
      if (ttype == UNRECOGNIZED) {
        if (this->strictConfigChecking == true) {
          local_3a8._M_allocated_capacity = (size_type)local_2d0._M_dataplus._M_p;
          local_3a8._8_8_ = local_2d0._M_string_length;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)&local_3a8;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x1f;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&stack0xfffffffffffffc38,(v11 *)"unrecognized translator type:{}",
                     fmt_00,args_00);
          message_06._M_str = (char *)uVar24;
          message_06._M_len = uStack_3c0;
          logMessage(local_320,0,message_06);
          pHVar20 = (HelicsException *)__cxa_allocate_exception(0x28);
          message_09._M_str = (char *)uVar24;
          message_09._M_len = uStack_3c0;
          HelicsException::HelicsException(pHVar20,message_09);
          *(undefined ***)pHVar20 = &PTR__HelicsException_004caa00;
          __cxa_throw(pHVar20,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
        }
        local_3a8._M_allocated_capacity = (size_type)local_2d0._M_dataplus._M_p;
        local_3a8._8_8_ = local_2d0._M_string_length;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&local_3a8;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x24;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc38,(v11 *)"unrecognized translator operation:{}",
                   fmt,args);
        message_01._M_str = (char *)uVar24;
        message_01._M_len = uStack_3c0;
        logMessage(this,3,message_01);
LAB_001e2980:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
      }
      else {
        local_60 = (char *)local_1a8._M_string_length;
        paStack_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_1a8._M_dataplus._M_p;
        endpointType._M_str = (char *)local_1a8._M_string_length;
        endpointType._M_len = (size_t)local_230._M_dataplus._M_p;
        units_00._M_str = in_stack_fffffffffffffc30._M_p;
        units_00._M_len = (size_t)local_1a8._M_dataplus._M_p;
        name._M_str = local_270._M_dataplus._M_p;
        name._M_len = local_270._M_string_length;
        in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                local_230._M_string_length;
        callback_00.iface = generateTranslator(this,(bool)uVar23,name,ttype,endpointType,units_00);
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        local_348.field_2._M_local_buf[4] = 's';
        local_348.field_2._M_allocated_capacity._0_4_ = 0x67616c66;
        local_348._M_string_length = 5;
        local_348.field_2._M_local_buf[5] = '\0';
        local_368._8_8_ = local_320;
        local_368._0_8_ = callback_00.iface;
        if ((*pbVar16 ==
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x1) &&
           (iVar10 = CLI::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                     ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                              **)(pbVar16 + 8),&local_348),
           iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar16,&local_348);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_2f0,pvVar11);
          if (local_2f0._M_local_buf[0] == '\x02') {
            uVar24 = &local_2f0;
            uStack_3c0 = (_Rb_tree_node_base *)0x0;
            local_3b8._8_8_ = (code *)0x8000000000000000;
            local_3b8._0_8_ = *(undefined8 *)local_2f0._8_8_;
            local_3a8._8_8_ = 0;
            local_398._8_8_ = (code *)0x8000000000000000;
            local_398._0_8_ = *(size_type *)(local_2f0._8_8_ + 8);
            local_3a8._M_allocated_capacity = uVar24;
            while (bVar7 = nlohmann::json_abi_v3_11_3::detail::
                           iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           ::
                           operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                     ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)&stack0xfffffffffffffc38,
                                      (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)&local_3a8), !bVar7) {
              pbVar17 = nlohmann::json_abi_v3_11_3::detail::
                        iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                     *)&stack0xfffffffffffffc38);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_388,pbVar17);
              loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Translator>
              ::anon_class_16_2_14a9c628::operator()
                        ((anon_class_16_2_14a9c628 *)(local_378 + 0x10),(string *)&local_388);
              if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
                operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1)
                               );
              }
              if (*(char *)uVar24 == '\x02') {
                local_3b8._0_8_ = local_3b8._0_8_ + 0x10;
              }
              else if (*(char *)uVar24 == '\x01') {
                uStack_3c0 = std::_Rb_tree_increment((_Rb_tree_node_base *)uStack_3c0);
              }
              else {
                local_3b8._8_8_ = local_3b8._8_8_ + 1;
              }
            }
          }
          else {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((string *)&stack0xfffffffffffffc38,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_2f0);
            loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Translator>
            ::anon_class_16_2_14a9c628::operator()
                      ((anon_class_16_2_14a9c628 *)(local_378 + 0x10),
                       (string *)&stack0xfffffffffffffc38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar24 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8) {
              operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
            }
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_2f0);
        }
        if ((((local_348._M_dataplus._M_p + -1)[local_348._M_string_length] == 's') &&
            (CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             pop_back(&local_348),
            *pbVar16 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x1)) &&
           (iVar10 = CLI::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                     ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                              **)(pbVar16 + 8),&local_348),
           iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar16,&local_348);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((string *)&stack0xfffffffffffffc38,pvVar11);
          loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Translator>
          ::anon_class_16_2_14a9c628::operator()
                    ((anon_class_16_2_14a9c628 *)(local_378 + 0x10),
                     (string *)&stack0xfffffffffffffc38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar24 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8) {
            operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,
                          CONCAT26(local_348.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_348.field_2._M_local_buf[5],
                                            CONCAT14(local_348.field_2._M_local_buf[4],
                                                     local_348.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_3b8._8_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
             ::_M_invoke;
        local_3b8._0_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
             ::_M_manager;
        local_3a8._M_allocated_capacity = 0;
        local_3a8._8_8_ = 0;
        local_398._8_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
             ::_M_invoke;
        local_398._0_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
             ::_M_manager;
        local_388._8_8_ = 0;
        local_378._8_8_ =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
             ::_M_invoke;
        local_378._0_8_ =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
             ::_M_manager;
        local_388._M_allocated_capacity = (size_type)callback_00.iface;
        processOptions((json *)pbVar16,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&stack0xfffffffffffffc38,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_3a8,(function<void_(int,_int)> *)&local_388);
        if ((_func_int **)local_378._0_8_ != (_func_int **)0x0) {
          (*(code *)local_378._0_8_)(&local_388,&local_388,3);
        }
        if ((code *)local_398._0_8_ != (code *)0x0) {
          (*(code *)local_398._0_8_)(&local_3a8,&local_3a8,3);
        }
        if ((code *)local_3b8._0_8_ != (code *)0x0) {
          (*(code *)local_3b8._0_8_)
                    ((string *)&stack0xfffffffffffffc38,(string *)&stack0xfffffffffffffc38,3);
        }
        local_3b8._0_5_ = 0x6f666e69;
        uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_3b8;
        if ((*pbVar16 ==
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x1) &&
           (iVar10 = CLI::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                     ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                              **)(pbVar16 + 8),(key_type *)&stack0xfffffffffffffc38),
           iVar10._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) {
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar16,(key_type *)&stack0xfffffffffffffc38);
          if ((pvVar11->m_data).m_type == string) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_2f0,pvVar11);
          }
          else {
            fileops::generateJsonString((string *)&local_2f0,pvVar11,true);
          }
        }
        else {
          local_2f0._M_allocated_capacity = (size_type)&local_2e0;
          local_2f0._8_8_ = (size_type *)0x0;
          local_2e0._M_local_buf[0] = '\0';
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
        if ((size_type *)local_2f0._8_8_ != (size_type *)0x0) {
          pCVar5 = ((callback_00.iface)->super_Interface).mCore;
          (*pCVar5->_vptr_Core[0x60])
                    (pCVar5,(ulong)(uint)((callback_00.iface)->super_Interface).handle.hid);
        }
        local_3b8._8_8_ =
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
             ::_M_invoke;
        local_3b8._0_8_ =
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
             ::_M_manager;
        loadTags((json *)pbVar16,
                 (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)&stack0xfffffffffffffc38);
        if ((code *)local_3b8._0_8_ != (code *)0x0) {
          (*(code *)local_3b8._0_8_)
                    ((string *)&stack0xfffffffffffffc38,(string *)&stack0xfffffffffffffc38,3);
        }
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        local_318.field_2._M_allocated_capacity._4_2_ = 0x6563;
        local_318.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
        local_318._M_string_length = 6;
        local_318.field_2._M_local_buf[6] = '\0';
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        local_290.field_2._M_allocated_capacity._0_4_ = 0x67726174;
        local_290._M_string_length = 7;
        local_290.field_2._M_allocated_capacity._4_4_ = 0x737465;
        local_3a8._M_allocated_capacity = (size_type)local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_318._M_dataplus._M_p,
                   (undefined1 *)((long)&local_318.field_2 + 6));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   "_");
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3a8,local_290._M_dataplus._M_p,local_290._M_string_length);
        uVar24 = (pbVar18->_M_dataplus)._M_p;
        paVar22 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 == paVar22) {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
          local_3b8._8_8_ = *(long *)((long)&pbVar18->field_2 + 8);
          uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_3b8;
        }
        else {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
        }
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar22;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        bVar7 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                          ((json *)pbVar16,(string *)&stack0xfffffffffffffc38,callback_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
        if ((undefined1 *)local_3a8._M_allocated_capacity != local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
        }
        if (!bVar7) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_388,&local_318,&local_290);
          bVar7 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                            ((json *)pbVar16,(string *)&local_388,callback_00);
          if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
            operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1));
          }
          _Var6._M_p = local_290._M_dataplus._M_p;
          if (!bVar7) {
            iVar9 = toupper((int)*local_290._M_dataplus._M_p);
            *_Var6._M_p = (char)iVar9;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_378 + 0x10),&local_318,&local_290);
            addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                      ((json *)pbVar16,(string *)(local_378 + 0x10),callback_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT44(local_290.field_2._M_allocated_capacity._4_4_,
                                   local_290.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,
                          CONCAT17(local_318.field_2._M_local_buf[7],
                                   CONCAT16(local_318.field_2._M_local_buf[6],
                                            CONCAT24(local_318.field_2._M_allocated_capacity._4_2_,
                                                     local_318.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        local_318.field_2._M_allocated_capacity._0_4_ = 0x74736564;
        local_318.field_2._M_allocated_capacity._4_2_ = 0x6e69;
        local_318.field_2._M_local_buf[6] = 'a';
        local_318.field_2._7_4_ = 0x6e6f6974;
        local_318._M_string_length = 0xb;
        local_318.field_2._M_local_buf[0xb] = '\0';
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        local_2b0.field_2._M_allocated_capacity._0_4_ = 0x67726174;
        local_2b0._M_string_length = 7;
        local_2b0.field_2._M_allocated_capacity._4_4_ = 0x737465;
        local_3a8._M_allocated_capacity = (size_type)local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_318._M_dataplus._M_p,
                   (undefined1 *)((long)&local_318.field_2 + 0xb));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   "_");
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3a8,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
        uVar24 = (pbVar18->_M_dataplus)._M_p;
        paVar22 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 == paVar22) {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
          local_3b8._8_8_ = *(long *)((long)&pbVar18->field_2 + 8);
          uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_3b8;
        }
        else {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
        }
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar22;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        bVar7 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                          ((json *)pbVar16,(string *)&stack0xfffffffffffffc38,callback_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
        if ((undefined1 *)local_3a8._M_allocated_capacity != local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
        }
        if (!bVar7) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_388,&local_318,&local_2b0);
          bVar7 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                            ((json *)pbVar16,(string *)&local_388,callback_00);
          if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
            operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1));
          }
          _Var6._M_p = local_2b0._M_dataplus._M_p;
          if (!bVar7) {
            iVar9 = toupper((int)*local_2b0._M_dataplus._M_p);
            *_Var6._M_p = (char)iVar9;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_378 + 0x10),&local_318,&local_2b0);
            addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                      ((json *)pbVar16,(string *)(local_378 + 0x10),callback_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,
                          CONCAT44(local_2b0.field_2._M_allocated_capacity._4_4_,
                                   local_2b0.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,
                          CONCAT17(local_318.field_2._M_local_buf[7],
                                   CONCAT16(local_318.field_2._M_local_buf[6],
                                            CONCAT24(local_318.field_2._M_allocated_capacity._4_2_,
                                                     local_318.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_allocated_capacity != &local_2e0) {
          operator_delete((void *)local_2f0._M_allocated_capacity,
                          CONCAT71(local_2e0._M_allocated_capacity._1_7_,local_2e0._M_local_buf[0])
                          + 1);
        }
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"source","");
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"endpoints","");
        local_3a8._M_allocated_capacity = (size_type)local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_348._M_dataplus._M_p,
                   local_348._M_string_length + local_348._M_dataplus._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   "_");
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3a8,local_e8._M_dataplus._M_p,local_e8._M_string_length);
        uVar24 = (pbVar18->_M_dataplus)._M_p;
        paVar22 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 == paVar22) {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
          local_3b8._8_8_ = *(long *)((long)&pbVar18->field_2 + 8);
          uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_3b8;
        }
        else {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
        }
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar22;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__6>
                          ((json *)pbVar16,(string *)&stack0xfffffffffffffc38,
                           (anon_class_8_1_36d583d8)callback_00.iface);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
        if ((undefined1 *)local_3a8._M_allocated_capacity != local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
        }
        if (!bVar7) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_388,&local_348,&local_e8);
          bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__6>
                            ((json *)pbVar16,(string *)&local_388,
                             (anon_class_8_1_36d583d8)callback_00.iface);
          if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
            operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1));
          }
          _Var6._M_p = local_e8._M_dataplus._M_p;
          if (!bVar7) {
            iVar9 = toupper((int)*local_e8._M_dataplus._M_p);
            *_Var6._M_p = (char)iVar9;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_378 + 0x10),&local_348,&local_e8);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__6>
                      ((json *)pbVar16,(string *)(local_378 + 0x10),
                       (anon_class_8_1_36d583d8)callback_00.iface);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,
                          CONCAT26(local_348.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_348.field_2._M_local_buf[5],
                                            CONCAT14(local_348.field_2._M_local_buf[4],
                                                     local_348.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"destination","");
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"endpoints","");
        local_3a8._M_allocated_capacity = (size_type)local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_348._M_dataplus._M_p,
                   local_348._M_string_length + local_348._M_dataplus._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   "_");
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3a8,local_108._M_dataplus._M_p,local_108._M_string_length);
        uVar24 = (pbVar18->_M_dataplus)._M_p;
        paVar22 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 == paVar22) {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
          local_3b8._8_8_ = *(long *)((long)&pbVar18->field_2 + 8);
          uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_3b8;
        }
        else {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
        }
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar22;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
                          ((json *)pbVar16,(string *)&stack0xfffffffffffffc38,
                           (anon_class_8_1_36d583d8)callback_00.iface);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
        if ((undefined1 *)local_3a8._M_allocated_capacity != local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
        }
        if (!bVar7) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_388,&local_348,&local_108);
          bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
                            ((json *)pbVar16,(string *)&local_388,
                             (anon_class_8_1_36d583d8)callback_00.iface);
          if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
            operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1));
          }
          _Var6._M_p = local_108._M_dataplus._M_p;
          if (!bVar7) {
            iVar9 = toupper((int)*local_108._M_dataplus._M_p);
            *_Var6._M_p = (char)iVar9;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_378 + 0x10),&local_348,&local_108);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
                      ((json *)pbVar16,(string *)(local_378 + 0x10),
                       (anon_class_8_1_36d583d8)callback_00.iface);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,
                          CONCAT26(local_348.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_348.field_2._M_local_buf[5],
                                            CONCAT14(local_348.field_2._M_local_buf[4],
                                                     local_348.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"source","");
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"publications","");
        local_3a8._M_allocated_capacity = (size_type)local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_348._M_dataplus._M_p,
                   local_348._M_string_length + local_348._M_dataplus._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   "_");
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3a8,local_128._M_dataplus._M_p,local_128._M_string_length);
        uVar24 = (pbVar18->_M_dataplus)._M_p;
        paVar22 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 == paVar22) {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
          local_3b8._8_8_ = *(long *)((long)&pbVar18->field_2 + 8);
          uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_3b8;
        }
        else {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
        }
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar22;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__8>
                          ((json *)pbVar16,(string *)&stack0xfffffffffffffc38,
                           (anon_class_8_1_36d583d8)callback_00.iface);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
        if ((undefined1 *)local_3a8._M_allocated_capacity != local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
        }
        if (!bVar7) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_388,&local_348,&local_128);
          bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__8>
                            ((json *)pbVar16,(string *)&local_388,
                             (anon_class_8_1_36d583d8)callback_00.iface);
          if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
            operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1));
          }
          _Var6._M_p = local_128._M_dataplus._M_p;
          if (!bVar7) {
            iVar9 = toupper((int)*local_128._M_dataplus._M_p);
            *_Var6._M_p = (char)iVar9;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_378 + 0x10),&local_348,&local_128);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__8>
                      ((json *)pbVar16,(string *)(local_378 + 0x10),
                       (anon_class_8_1_36d583d8)callback_00.iface);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,
                          CONCAT26(local_348.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_348.field_2._M_local_buf[5],
                                            CONCAT14(local_348.field_2._M_local_buf[4],
                                                     local_348.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"destination","");
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"inputs","");
        local_3a8._M_allocated_capacity = (size_type)local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_348._M_dataplus._M_p,
                   local_348._M_string_length + local_348._M_dataplus._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   "_");
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3a8,local_148._M_dataplus._M_p,local_148._M_string_length);
        uVar24 = (pbVar18->_M_dataplus)._M_p;
        paVar22 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 == paVar22) {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
          local_3b8._8_8_ = *(long *)((long)&pbVar18->field_2 + 8);
          uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_3b8;
        }
        else {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
        }
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar22;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__9>
                          ((json *)pbVar16,(string *)&stack0xfffffffffffffc38,
                           (anon_class_8_1_36d583d8)callback_00.iface);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
        if ((undefined1 *)local_3a8._M_allocated_capacity != local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
        }
        if (!bVar7) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_388,&local_348,&local_148);
          bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__9>
                            ((json *)pbVar16,(string *)&local_388,
                             (anon_class_8_1_36d583d8)callback_00.iface);
          if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
            operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1));
          }
          _Var6._M_p = local_148._M_dataplus._M_p;
          if (!bVar7) {
            iVar9 = toupper((int)*local_148._M_dataplus._M_p);
            *_Var6._M_p = (char)iVar9;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_378 + 0x10),&local_348,&local_148);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__9>
                      ((json *)pbVar16,(string *)(local_378 + 0x10),
                       (anon_class_8_1_36d583d8)callback_00.iface);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,
                          CONCAT26(local_348.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_348.field_2._M_local_buf[5],
                                            CONCAT14(local_348.field_2._M_local_buf[4],
                                                     local_348.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"source","");
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"filters","");
        local_3a8._M_allocated_capacity = (size_type)local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_348._M_dataplus._M_p,
                   local_348._M_string_length + local_348._M_dataplus._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   "_");
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3a8,local_168._M_dataplus._M_p,local_168._M_string_length);
        uVar24 = (pbVar18->_M_dataplus)._M_p;
        paVar22 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 == paVar22) {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
          local_3b8._8_8_ = *(long *)((long)&pbVar18->field_2 + 8);
          uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_3b8;
        }
        else {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
        }
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar22;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__10>
                          ((json *)pbVar16,(string *)&stack0xfffffffffffffc38,
                           (anon_class_8_1_36d583d8)callback_00.iface);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar24 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8) {
          operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
        }
        if ((undefined1 *)local_3a8._M_allocated_capacity != local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
        }
        if (!bVar7) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_388,&local_348,&local_168);
          bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__10>
                            ((json *)pbVar16,(string *)&local_388,
                             (anon_class_8_1_36d583d8)callback_00.iface);
          if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
            operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1));
          }
          _Var6._M_p = local_168._M_dataplus._M_p;
          if (!bVar7) {
            iVar9 = toupper((int)*local_168._M_dataplus._M_p);
            *_Var6._M_p = (char)iVar9;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_378 + 0x10),&local_348,&local_168);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__10>
                      ((json *)pbVar16,(string *)(local_378 + 0x10),
                       (anon_class_8_1_36d583d8)callback_00.iface);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,
                          CONCAT26(local_348.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_348.field_2._M_local_buf[5],
                                            CONCAT14(local_348.field_2._M_local_buf[4],
                                                     local_348.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"destination","");
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"filters","");
        local_3a8._M_allocated_capacity = (size_type)local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_348._M_dataplus._M_p,
                   local_348._M_string_length + local_348._M_dataplus._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   "_");
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3a8,local_188._M_dataplus._M_p,local_188._M_string_length);
        uVar15 = (pbVar18->_M_dataplus)._M_p;
        paVar22 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 == paVar22) {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
          local_3b8._8_8_ = *(long *)((long)&pbVar18->field_2 + 8);
          uVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_3b8;
        }
        else {
          local_3b8._0_8_ = paVar22->_M_allocated_capacity;
        }
        uStack_3c0 = pbVar18->_M_string_length;
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar22;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__11>
                          ((json *)pbVar16,(string *)&stack0xfffffffffffffc38,
                           (anon_class_8_1_36d583d8)callback_00.iface);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8) {
          operator_delete((void *)uVar15,local_3b8._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,(ulong)(local_398._0_8_ + 1));
        }
        if (!bVar7) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_388,&local_348,&local_188);
          bVar7 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__11>
                            ((json *)pbVar16,(string *)&local_388,
                             (anon_class_8_1_36d583d8)callback_00.iface);
          if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
            operator_delete((void *)local_388._M_allocated_capacity,(ulong)(local_378._0_8_ + 1));
          }
          _Var6._M_p = local_188._M_dataplus._M_p;
          if (!bVar7) {
            iVar9 = toupper((int)*local_188._M_dataplus._M_p);
            *_Var6._M_p = (char)iVar9;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_378 + 0x10),&local_348,&local_188);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__11>
                      ((json *)pbVar16,(string *)(local_378 + 0x10),
                       (anon_class_8_1_36d583d8)callback_00.iface);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,
                          CONCAT26(local_348.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_348.field_2._M_local_buf[5],
                                            CONCAT14(local_348.field_2._M_local_buf[4],
                                                     local_348.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if (*pbVar16 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x1) {
          bVar7 = local_320->strictConfigChecking;
          cVar12 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                   ::_M_find_tr<char[11],void>
                             (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                **)(pbVar16 + 8),(char (*) [11])"properties");
          if (cVar12._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8)) {
            uVar19 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>(pbVar16,"properties");
            if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)uVar19 ==
                (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 )0x1) {
              cVar14 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       ::_M_find_tr<char[5],void>
                                 (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                    **)(uVar19 + 8),(char (*) [5])0x3e09a3);
              if (((cVar14._M_node !=
                    (_Base_ptr)
                    (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       **)(uVar19 + 8) + 8)) &&
                  (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)uVar19 ==
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    )0x1)) &&
                 (cVar14 = std::
                           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           ::_M_find_tr<char[6],void>
                                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                        **)(uVar19 + 8),(char (*) [6])0x3f8ab9),
                 cVar14._M_node != (_Base_ptr)(*(long *)(uVar19 + 8) + 8))) {
                pvVar11 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)uVar19,"value");
                if ((byte)((pvVar11->m_data).m_type - number_integer) < 3) {
                  pvVar11 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>
                                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                        *)uVar19,"name");
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            ((string *)&stack0xfffffffffffffc38,pvVar11);
                  uVar24 = uVar15;
                  pvVar11 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>
                                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                        *)uVar19,"value");
                  local_3a8._M_allocated_capacity = 0;
                  nlohmann::json_abi_v3_11_3::detail::
                  get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                            (pvVar11,(double *)&local_3a8._M_allocated_capacity);
                  (*((callback_00.iface)->super_Interface)._vptr_Interface[5])
                            ((int)local_3a8._M_allocated_capacity,callback_00.iface,uStack_3c0,
                             uVar15);
                }
                else {
                  pvVar11 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>
                                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                        *)uVar19,"name");
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            ((string *)&stack0xfffffffffffffc38,pvVar11);
                  uVar24 = uVar15;
                  pvVar11 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>
                                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                        *)uVar19,"value");
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&local_3a8,pvVar11);
                  (*((callback_00.iface)->super_Interface)._vptr_Interface[6])
                            (callback_00.iface,uStack_3c0,uVar15,local_3a8._8_8_,
                             local_3a8._M_allocated_capacity);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a8._M_allocated_capacity !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398) {
                    operator_delete((void *)local_3a8._M_allocated_capacity,
                                    (ulong)(local_398._0_8_ + 1));
                  }
                }
                goto LAB_001e2980;
              }
            }
            else if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)uVar19 ==
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      )0x2) {
              uStack_3c0 = (_Rb_tree_node_base *)0x0;
              local_3b8._0_8_ = 0;
              local_3b8._8_8_ = (code *)0x8000000000000000;
              bVar2 = *(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)uVar19;
              if (bVar2 == (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            )0x0) {
                local_3b8._8_8_ = (code *)0x1;
LAB_001e43bb:
                local_3a8._8_8_ = 0;
                local_398._0_8_ = (code *)0x0;
                local_398._8_8_ = (code *)0x1;
              }
              else if (bVar2 == (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 )0x2) {
                local_3b8._0_8_ = **(size_type **)(uVar19 + 8);
                local_3a8._8_8_ = 0;
                local_398._8_8_ = (code *)0x8000000000000000;
                local_398._0_8_ = *(size_type *)(*(long *)(uVar19 + 8) + 8);
              }
              else {
                if (bVar2 != (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              )0x1) {
                  local_3b8._8_8_ = (code *)0x0;
                  goto LAB_001e43bb;
                }
                uStack_3c0 = *(undefined8 *)(*(long *)(uVar19 + 8) + 0x18);
                local_398._0_8_ = (code *)0x0;
                local_398._8_8_ = (code *)0x8000000000000000;
                local_3a8._8_8_ = *(long *)(uVar19 + 8) + 8;
              }
              local_3a8._M_allocated_capacity = uVar19;
              bVar8 = nlohmann::json_abi_v3_11_3::detail::
                      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      ::
                      operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                  *)&stack0xfffffffffffffc38,
                                 (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                  *)&local_3a8);
              while (bVar8 == false) {
                pbVar16 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)nlohmann::json_abi_v3_11_3::detail::
                             iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                          *)&stack0xfffffffffffffc38);
                if (*pbVar16 ==
                    (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     )0x1) {
                  cVar14 = std::
                           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           ::_M_find_tr<char[5],void>
                                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                        **)(pbVar16 + 8),(char (*) [5])0x3e09a3);
                  if (((cVar14._M_node ==
                        (_Base_ptr)
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)(pbVar16 + 8) + 8)) ||
                      (*pbVar16 !=
                       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        )0x1)) ||
                     (cVar14 = std::
                               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                               ::_M_find_tr<char[6],void>
                                         (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                            **)(pbVar16 + 8),(char (*) [6])0x3f8ab9),
                     cVar14._M_node == (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))) goto LAB_001e44f1;
                  pvVar11 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>(pbVar16,"value");
                  if ((byte)((pvVar11->m_data).m_type - number_integer) < 3) {
                    pvVar11 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>(pbVar16,"name");
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (&local_388,pvVar11);
                    uVar15 = local_388._8_8_;
                    uVar24 = local_388._M_allocated_capacity;
                    pvVar11 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>(pbVar16,"value");
                    local_368._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    nlohmann::json_abi_v3_11_3::detail::
                    get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                              (pvVar11,(double *)(local_378 + 0x10));
                    (*((callback_00.iface)->super_Interface)._vptr_Interface[5])
                              ((int)local_368._0_8_,callback_00.iface,uVar15,uVar24);
                    if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
                      operator_delete((void *)local_388._M_allocated_capacity,
                                      (ulong)(local_378._0_8_ + 1));
                    }
                  }
                  else {
                    pvVar11 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>(pbVar16,"name");
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (&local_388,pvVar11);
                    uVar15 = local_388._8_8_;
                    uVar24 = local_388._M_allocated_capacity;
                    pvVar11 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>(pbVar16,"value");
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (local_378 + 0x10,pvVar11);
                    (*((callback_00.iface)->super_Interface)._vptr_Interface[6])
                              (callback_00.iface,uVar15,uVar24,local_368._8_8_,local_368._0_8_);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_368._0_8_ != &local_358) {
                      operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
                    }
                    if ((Filter *)local_388._M_allocated_capacity != (Filter *)local_378) {
                      operator_delete((void *)local_388._M_allocated_capacity,
                                      (ulong)(local_378._0_8_ + 1));
                    }
                  }
                }
                else {
LAB_001e44f1:
                  if (bVar7 != false) goto LAB_001e46ee;
                  message_03._M_str = "interface properties require \"name\" and \"value\" fields";
                  message_03._M_len = 0x36;
                  logMessage(local_320,3,message_03);
                }
                if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      *)uVar19 ==
                    (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     )0x2) {
                  local_3b8._0_8_ = local_3b8._0_8_ + 0x10;
                }
                else if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)uVar19 ==
                         (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          )0x1) {
                  uStack_3c0 = std::_Rb_tree_increment((_Rb_tree_node_base *)uStack_3c0);
                }
                else {
                  local_3b8._8_8_ = local_3b8._8_8_ + 1;
                }
                bVar8 = nlohmann::json_abi_v3_11_3::detail::
                        iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        ::
                        operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                  ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                    *)&stack0xfffffffffffffc38,
                                   (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                    *)&local_3a8);
              }
              goto LAB_001e422b;
            }
            if (bVar7 != false) {
LAB_001e46ee:
              message_05._M_str = "interface properties require \"name\" and \"value\" fields";
              message_05._M_len = 0x36;
              logMessage(local_320,0,message_05);
              pHVar20 = (HelicsException *)__cxa_allocate_exception(0x28);
              message_08._M_str = "interface properties require \"name\" and \"value\" fields";
              message_08._M_len = 0x36;
              HelicsException::HelicsException(pHVar20,message_08);
              *(undefined ***)pHVar20 = &PTR__HelicsException_004caa00;
              __cxa_throw(pHVar20,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
            }
            message_02._M_str = "interface properties require \"name\" and \"value\" fields";
            message_02._M_len = 0x36;
            logMessage(local_320,3,message_02);
          }
        }
      }
LAB_001e422b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                 local_1a8.field_2._M_local_buf[0]) + 1);
      }
      this = local_320;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                 local_230.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,
                        CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                                 local_2d0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,
                        CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                 local_270.field_2._M_local_buf[0]) + 1);
      }
      if (*(char *)local_250.m_object == '\x02') {
        local_250.m_it.array_iterator._M_current = local_250.m_it.array_iterator._M_current + 1;
      }
      else if (*(char *)local_250.m_object == '\x01') {
        local_250.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_250.m_it.object_iterator._M_node);
      }
      else {
        local_250.m_it.primitive_iterator.m_it = local_250.m_it.primitive_iterator.m_it + 1;
      }
      bVar7 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        (&local_250,
                         (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)&local_210);
      pbVar16 = local_88;
    } while (!bVar7);
  }
LAB_001e22d9:
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_70,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)pbVar16);
  uVar24 = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc38,"globals","");
  local_3a8._8_8_ = 0;
  local_398._8_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1547:39)>
       ::_M_invoke;
  local_398._0_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1547:39)>
       ::_M_manager;
  local_3a8._M_allocated_capacity = (size_type)this;
  arrayPairProcess((json *)&local_70,(string *)&stack0xfffffffffffffc38,
                   (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&local_3a8);
  if ((code *)local_398._0_8_ != (code *)0x0) {
    (*(code *)local_398._0_8_)(&local_3a8,&local_3a8,3);
  }
  if ((undefined1 *)uVar24 != local_3b8) {
    operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_70);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_80,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)pbVar16);
  uVar24 = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc38,"aliases","");
  local_3a8._8_8_ = 0;
  local_398._8_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1550:39)>
       ::_M_invoke;
  local_398._0_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1550:39)>
       ::_M_manager;
  local_3a8._M_allocated_capacity = (size_type)this;
  arrayPairProcess((json *)&local_80,(string *)&stack0xfffffffffffffc38,
                   (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&local_3a8);
  if ((code *)local_398._0_8_ != (code *)0x0) {
    (*(code *)local_398._0_8_)(&local_3a8,&local_3a8,3);
  }
  if ((undefined1 *)uVar24 != local_3b8) {
    operator_delete((void *)uVar24,local_3b8._0_8_ + 1);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_80);
  local_3b8._8_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1554:20)>
       ::_M_invoke;
  local_3b8._0_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1554:20)>
       ::_M_manager;
  loadTags((json *)pbVar16,
           (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            *)&stack0xfffffffffffffc38);
  if ((code *)local_3b8._0_8_ != (code *)0x0) {
    (*(code *)local_3b8._0_8_)(&stack0xfffffffffffffc38,&stack0xfffffffffffffc38,3);
  }
  if (*pbVar16 ==
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    cVar14 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
             ::_M_find_tr<char[7],void>
                       (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                          **)(pbVar16 + 8),(char (*) [7])0x3e0fa4);
    if (cVar14._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8)) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::operator[]<char_const>(pbVar16,"helics");
      registerConnectorInterfacesJsonDetail(this,(JsonBuffer *)&stack0xfffffffffffffc38);
    }
    if (*pbVar16 ==
        (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         )0x1) {
      cVar14 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
               ::_M_find_tr<char[21],void>
                         (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                            **)(pbVar16 + 8),(char (*) [21])"potential_interfaces");
      if ((cVar14._M_node !=
           (_Base_ptr)
           (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              **)(pbVar16 + 8) + 8)) ||
         ((*pbVar16 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1 && (cVar12 = std::
                              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                              ::_M_find_tr<char[30],void>
                                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                           **)(pbVar16 + 8),
                                         (char (*) [30])"potential_interface_templates"),
                    cVar12._M_node != (_Base_ptr)(*(long *)(pbVar16 + 8) + 8))))) {
        this_01._M_head_impl =
             (this->potManager)._M_t.
             super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
             .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl;
        if (this_01._M_head_impl == (PotentialInterfacesManager *)0x0) {
          pCVar5 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          this_01._M_head_impl = (PotentialInterfacesManager *)operator_new(200);
          PotentialInterfacesManager::PotentialInterfacesManager(this_01._M_head_impl,pCVar5,this);
          this_00 = &this->potManager;
          __ptr._M_head_impl =
               (this_00->_M_t).
               super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
               .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl;
          (this_00->_M_t).
          super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
          .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl =
               this_01._M_head_impl;
          if (__ptr._M_head_impl != (PotentialInterfacesManager *)0x0) {
            std::default_delete<helics::PotentialInterfacesManager>::operator()
                      ((default_delete<helics::PotentialInterfacesManager> *)this_00,
                       __ptr._M_head_impl);
            this_01._M_head_impl =
                 (this_00->_M_t).
                 super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
                 .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl;
          }
        }
        PotentialInterfacesManager::loadPotentialInterfaces(this_01._M_head_impl,(json *)pbVar16);
        this->hasPotentialInterfaces = true;
      }
    }
  }
  return;
}

Assistant:

void Federate::registerConnectorInterfacesJsonDetail(const fileops::JsonBuffer& jsonBuffer)
{
    using fileops::getOrDefault;
    const auto& json = jsonBuffer.json();
    bool defaultGlobal = false;
    fileops::replaceIfMember(json, "defaultglobal", defaultGlobal);

    const nlohmann::json& iface = (json.contains("interfaces")) ? json["interfaces"] : json;

    if (iface.contains("filters")) {
        for (const auto& filt : iface["filters"]) {
            const std::string key = getOrDefault(filt, "name", emptyStr);
            const std::string inputType = getOrDefault(filt, "inputType", emptyStr);
            const std::string outputType = getOrDefault(filt, "outputType", emptyStr);
            const bool cloningFlag = getOrDefault(filt, "cloning", false);
            const bool useTypes = !((inputType.empty()) && (outputType.empty()));
            const bool global = fileops::getOrDefault(filt, "global", defaultGlobal);
            const std::string operation =
                getOrDefault(filt,
                             "operation",
                             (cloningFlag) ? std::string("clone") : std::string("custom"));

            auto opType = filterTypeFromString(operation);
            if (!checkValidFilterType(useTypes, opType, operation)) {
                continue;
            }
            auto& filter =
                generateFilter(this, global, cloningFlag, key, opType, inputType, outputType);
            loadOptions(this, filt, filter);

            addTargetVariations(filt, "source", "endpoints", [&filter](const std::string& target) {
                filter.addSourceTarget(target);
            });
            addTargetVariations(filt,
                                "destination",
                                "endpoints",
                                [&filter](const std::string& target) {
                                    filter.addDestinationTarget(target);
                                });

            if (cloningFlag) {
                addTargets(filt, "delivery", [&filter](const std::string& target) {
                    static_cast<CloningFilter&>(filter).addDeliveryEndpoint(target);
                });
            }

            loadPropertiesJson(this, filter, filt, strictConfigChecking);
        }
    }
    if (iface.contains("translators")) {
        for (const auto& trans : iface["translators"]) {
            const std::string key = getOrDefault(trans, "name", emptyStr);

            std::string ttype = getOrDefault(trans, "type", std::string("custom"));
            auto opType = translatorTypeFromString(ttype);
            auto etype = fileops::getOrDefault(trans, "endpointtype", emptyStr);
            auto units = fileops::getOrDefault(trans, "unit", emptyStr);
            fileops::replaceIfMember(trans, "units", units);
            const bool global = fileops::getOrDefault(trans, "global", defaultGlobal);

            if (opType == TranslatorTypes::UNRECOGNIZED) {
                if (strictConfigChecking) {
                    const std::string emessage =
                        fmt::format("unrecognized translator type:{}", ttype);
                    logMessage(HELICS_LOG_LEVEL_ERROR, emessage);

                    throw(InvalidParameter(emessage));
                }
                logMessage(HELICS_LOG_LEVEL_WARNING,
                           fmt::format("unrecognized translator operation:{}", ttype));
                continue;
            }
            auto& translator = generateTranslator(this, global, key, opType, etype, units);
            loadOptions(this, trans, translator);

            addTargetVariations(trans,
                                "source",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addSourceEndpoint(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addDestinationEndpoint(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "publications",
                                [&translator](const std::string& target) {
                                    translator.addPublication(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "inputs",
                                [&translator](const std::string& target) {
                                    translator.addInputTarget(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addSourceFilter(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addDestinationFilter(target);
                                });
            loadPropertiesJson(this, translator, trans, strictConfigChecking);
        }
    }
    arrayPairProcess(json, "globals", [this](std::string_view key, std::string_view val) {
        setGlobal(key, val);
    });
    arrayPairProcess(json, "aliases", [this](std::string_view key, std::string_view val) {
        addAlias(key, val);
    });

    loadTags(json, [this](std::string_view tagname, std::string_view tagvalue) {
        this->setTag(tagname, tagvalue);
    });
    if (json.contains("helics")) {
        registerConnectorInterfacesJsonDetail(fileops::JsonBuffer(json["helics"]));
    }

    if (json.contains("potential_interfaces") || json.contains("potential_interface_templates")) {
        if (!potManager) {
            potManager = std::make_unique<PotentialInterfacesManager>(coreObject.get(), this);
        }
        potManager->loadPotentialInterfaces(json);
        hasPotentialInterfaces = true;
    }
}